

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>::Read
          (TPZGeoElRefLess<pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>_>
           *this,TPZStream *buf,void *context)

{
  TPZStream *in_RDX;
  TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_> *in_RSI;
  long in_RDI;
  long *plVar1;
  void *unaff_retaddr;
  TPZStream *in_stack_00000008;
  uint i;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar2;
  
  TPZGeoEl::Read((TPZGeoEl *)context,in_stack_00000008,unaff_retaddr);
  pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_>::Read
            (in_RSI,in_RDX,(void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  for (uVar2 = 0; uVar2 < 7; uVar2 = uVar2 + 1) {
    plVar1 = (long *)(in_RDI + 0x928 + (ulong)uVar2 * 0x18);
    (**(code **)(*plVar1 + 0x30))(plVar1,in_RSI,in_RDX);
  }
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Read(TPZStream &buf, void *context){
    TPZGeoEl::Read(buf,context);
    fGeo.Read(buf,context);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Read(buf, context);
    }
}